

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock_tests.cpp
# Opt level: O3

void __thiscall
merkleblock_tests::merkleblock_construct_from_txids_not_found::test_method
          (merkleblock_construct_from_txids_not_found *this)

{
  long lVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  bool bVar5;
  readonly_property<bool> rVar6;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  lazy_ostream local_2d8;
  undefined1 *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  string *local_280;
  string *local_278;
  string *local_270;
  char *local_268;
  undefined **local_260;
  undefined1 local_258;
  undefined1 *local_250;
  string **local_248;
  undefined1 local_240 [16];
  shared_count asStack_230 [2];
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined1 local_200 [32];
  string local_1e0;
  _Storage<uint256,_true> local_1c0;
  char local_1a0;
  CPartialMerkleTree local_170;
  void *local_120;
  void *local_118;
  long local_110;
  undefined1 local_108 [24];
  string **ppsStack_f0;
  undefined1 local_e8;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  txids2;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  getBlock13b8a();
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &txids2._M_t._M_impl.super__Rb_tree_header._M_header;
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  txids2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  detail::FromHex<uint256>
            ((optional<uint256> *)&local_1c0._M_value,(detail *)0x40,(string_view)ZEXT816(0xea8e48))
  ;
  if (local_1a0 == '\0') {
    local_e8 = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    local_108._16_8_ = local_1c0._16_8_;
    ppsStack_f0 = (string **)local_1c0._24_8_;
    local_108._0_8_ = local_1c0._0_8_;
    local_108._8_8_ = local_1c0._8_8_;
    local_e8 = 1;
    std::
    _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
    ::_M_insert_unique<transaction_identifier<false>>
              ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                *)&txids2,(transaction_identifier<false> *)local_108);
    CMerkleBlock::CMerkleBlock
              ((CMerkleBlock *)&local_1c0._M_value,&block,(CBloomFilter *)0x0,&txids2);
    local_2a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_2a0 = "";
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x45;
    file.m_begin = (iterator)&local_2a8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2b8,msg);
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    CBlockHeader::GetHash((uint256 *)local_200,(CBlockHeader *)&local_1c0._M_value);
    base_blob<256u>::GetHex_abi_cxx11_(&local_1e0,local_200);
    CBlockHeader::GetHash((uint256 *)local_240,&block.super_CBlockHeader);
    base_blob<256u>::GetHex_abi_cxx11_((string *)local_220,local_240);
    if (local_1e0._M_string_length == local_220._8_8_) {
      if (local_1e0._M_string_length == 0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,
                                      local_1e0._M_dataplus._M_p._0_1_),(void *)local_220._0_8_,
                     local_1e0._M_string_length);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,bVar5);
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_c70466;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xea8ca3;
    ppsStack_f0 = &local_270;
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013ae148;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_248 = &local_278;
    local_278 = (string *)local_220;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013ae148;
    local_250 = boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_270 = &local_1e0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&vMatched,&local_2d8,1,2,REQUIRE,0xe70598,(size_t)&vIndex,0x45,
               local_108,"block.GetHash().GetHex()",&local_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
      operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_) !=
        &local_1e0.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_)
                      ,local_1e0.field_2._M_allocated_capacity + 1);
    }
    local_2e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_2e0 = "";
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x46;
    file_00.m_begin = (iterator)&local_2e8;
    msg_00.m_end = pvVar4;
    msg_00.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2f8,
               msg_00);
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(((long)local_118 - (long)local_120 >> 2) * -0x71c71c71c71c71c7);
    local_1e0._M_dataplus._M_p._0_1_ = local_118 == local_120;
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_allocated_capacity = 0;
    local_200._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_200._8_8_ = "";
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013ae0c8;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppsStack_f0 = (string **)local_220;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013ae108;
    local_250 = boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_248 = (string **)local_240;
    local_240._0_8_ = &vIndex;
    local_220._0_8_ = (assertion_result *)&vMatched;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1e0,&local_2d8,1,2,REQUIRE,0xe706ca,(size_t)local_200,0x46
               ,local_108,"0U",&local_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1e0.field_2._M_allocated_capacity);
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_320 = "";
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x4b;
    file_01.m_begin = (iterator)&local_328;
    msg_01.m_end = pvVar4;
    msg_01.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_338,
               msg_01);
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    CPartialMerkleTree::ExtractMatches((uint256 *)local_200,&local_170,&vMatched,&vIndex);
    base_blob<256u>::GetHex_abi_cxx11_(&local_1e0,local_200);
    base_blob<256u>::GetHex_abi_cxx11_((string *)local_220,&block.super_CBlockHeader.hashMerkleRoot)
    ;
    if (local_1e0._M_string_length == local_220._8_8_) {
      if (local_1e0._M_string_length == 0) {
        rVar6.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        iVar2 = bcmp((void *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,
                                      local_1e0._M_dataplus._M_p._0_1_),(void *)local_220._0_8_,
                     local_1e0._M_string_length);
        rVar6.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
      }
    }
    else {
      rVar6.super_class_property<bool>.value = (class_property<bool>)false;
    }
    local_240[0] = rVar6.super_class_property<bool>.value;
    local_240._8_8_ = (element_type *)0x0;
    asStack_230[0].pi_ = (sp_counted_base *)0x0;
    local_270 = (string *)0xea8c40;
    local_268 = "";
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013ae148;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppsStack_f0 = &local_278;
    local_248 = &local_280;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013ae148;
    local_250 = boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_280 = (string *)local_220;
    local_278 = &local_1e0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_240,&local_2d8,1,2,REQUIRE,0xea8d4d,(size_t)&local_270,0x4b
               ,local_108,"block.hashMerkleRoot.GetHex()",&local_260);
    boost::detail::shared_count::~shared_count(asStack_230);
    if ((assertion_result *)local_220._0_8_ != (assertion_result *)(local_220 + 0x10)) {
      operator_delete((void *)local_220._0_8_,local_210._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_) !=
        &local_1e0.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_)
                      ,local_1e0.field_2._M_allocated_capacity + 1);
    }
    local_348 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_340 = "";
    local_358 = &boost::unit_test::basic_cstring<char_const>::null;
    local_350 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x4c;
    file_02.m_begin = (iterator)&local_348;
    msg_02.m_end = pvVar4;
    msg_02.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_358,
               msg_02);
    local_270 = (string *)
                ((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start >> 5);
    local_1e0._M_dataplus._M_p._0_1_ =
         vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    local_278 = (string *)((ulong)local_278 & 0xffffffff00000000);
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_allocated_capacity = 0;
    local_200._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_200._8_8_ = "";
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013ae0c8;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppsStack_f0 = (string **)local_220;
    local_240._0_8_ = &local_278;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013ae108;
    local_250 = boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_248 = (string **)local_240;
    local_220._0_8_ = &local_270;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1e0,&local_2d8,1,2,REQUIRE,0xea8da5,(size_t)local_200,0x4c
               ,local_108,"0U",&local_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1e0.field_2._M_allocated_capacity);
    local_368 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_360 = "";
    local_378 = &boost::unit_test::basic_cstring<char_const>::null;
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x4d;
    file_03.m_begin = (iterator)&local_368;
    msg_03.m_end = pvVar4;
    msg_03.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_378,
               msg_03);
    local_270 = (string *)
                ((long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2);
    local_1e0._M_dataplus._M_p._0_1_ =
         vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_2d8.m_empty = false;
    local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
    local_2c8 = boost::unit_test::lazy_ostream::inst;
    local_2c0 = "";
    local_278 = (string *)((ulong)local_278 & 0xffffffff00000000);
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_allocated_capacity = 0;
    local_200._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_200._8_8_ = "";
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_013ae0c8;
    local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
    ppsStack_f0 = (string **)local_220;
    local_240._0_8_ = &local_278;
    local_258 = 0;
    local_260 = &PTR__lazy_ostream_013ae108;
    local_250 = boost::unit_test::lazy_ostream::inst;
    local_248 = (string **)local_240;
    local_220._0_8_ = &local_270;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1e0,&local_2d8,1,2,REQUIRE,0xea8e89,(size_t)local_200,0x4d
               ,local_108,"0U",&local_260);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1e0.field_2._M_allocated_capacity);
    if (vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_120 != (void *)0x0) {
      operator_delete(local_120,local_110 - (long)local_120);
    }
    if (local_170.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_170.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_170.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_170.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_170.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_170.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_170.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_170.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_170.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    }
    std::
    _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
    ::~_Rb_tree(&txids2._M_t);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&block.vtx);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkleblock_construct_from_txids_not_found)
{
    CBlock block = getBlock13b8a();

    std::set<Txid> txids2;
    txids2.insert(Txid::FromHex("c0ffee00003bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20").value());
    CMerkleBlock merkleBlock(block, txids2);

    BOOST_CHECK_EQUAL(merkleBlock.header.GetHash().GetHex(), block.GetHash().GetHex());
    BOOST_CHECK_EQUAL(merkleBlock.vMatchedTxn.size(), 0U);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;

    BOOST_CHECK_EQUAL(merkleBlock.txn.ExtractMatches(vMatched, vIndex).GetHex(), block.hashMerkleRoot.GetHex());
    BOOST_CHECK_EQUAL(vMatched.size(), 0U);
    BOOST_CHECK_EQUAL(vIndex.size(), 0U);
}